

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall YAJLImage::scan_markers(YAJLImage *this)

{
  ssize_t sVar1;
  ostream *this_00;
  size_t in_RCX;
  void *in_RDX;
  YAJLImage *local_18;
  YAJLImage *local_10;
  YAJLImage *this_local;
  
  local_10 = this;
  sVar1 = bitio::bitio_stream::read(this->bstream,0x10,in_RDX,in_RCX);
  if (sVar1 == 0xffd8) {
    local_18 = this;
    std::vector<YAJLFrame,std::allocator<YAJLFrame>>::
    emplace_back<YAJLMiscData*,bitio::bitio_stream*&>
              ((vector<YAJLFrame,std::allocator<YAJLFrame>> *)
               &(this->super_YAJLImageDescriptor).frames,(YAJLMiscData **)&local_18,&this->bstream);
    printf("Run completed at: %s for \'Image\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/image.cpp"
          );
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"SOI not found");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void YAJLImage::scan_markers() {
    // First check for SOI marker
    if (bstream->read(0x10) != markers::SOI) {
        std::cout << "SOI not found" << std::endl;
        return;
    }
    // parse one frame
    frames.emplace_back(&misc, bstream);
#ifdef DEBUG
    printf("Run completed at: %s for 'Image'\n", __FILE__);
#endif
}